

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O3

int fe_shift_frame(fe_t *fe,int16 *in,int32 len)

{
  ushort *puVar1;
  int16 *piVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  uVar4 = (uint)fe->frame_shift;
  if ((int)uVar4 < len) {
    len = uVar4;
  }
  iVar5 = (int)fe->frame_size - uVar4;
  lVar7 = (long)iVar5;
  memmove(fe->spch,fe->spch + fe->frame_shift,lVar7 * 2);
  memcpy(fe->spch + lVar7,in,(long)len * 2);
  uVar6 = (ulong)(uint)len;
  if (0 < len && fe->swap != '\0') {
    piVar2 = fe->spch;
    uVar3 = 0;
    do {
      puVar1 = (ushort *)(piVar2 + lVar7 + uVar3);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      uVar3 = uVar3 + 1;
    } while (uVar6 != uVar3);
  }
  if (fe->dither != '\0' && 0 < len) {
    do {
      uVar3 = genrand_int31();
      fe->spch[lVar7] = fe->spch[lVar7] + (ushort)((uVar3 & 3) == 0);
      lVar7 = lVar7 + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  iVar5 = fe_spch_to_frame(fe,iVar5 + len);
  return iVar5;
}

Assistant:

int
fe_shift_frame(fe_t * fe, int16 const *in, int32 len)
{
    int offset, i;

    if (len > fe->frame_shift)
        len = fe->frame_shift;
    offset = fe->frame_size - fe->frame_shift;

    /* Shift data into the raw speech buffer. */
    memmove(fe->spch, fe->spch + fe->frame_shift,
            offset * sizeof(*fe->spch));
    memcpy(fe->spch + offset, in, len * sizeof(*fe->spch));
    /* Swap and dither if necessary. */
    if (fe->swap)
        for (i = 0; i < len; ++i)
            SWAP_INT16(&fe->spch[offset + i]);
    if (fe->dither)
        for (i = 0; i < len; ++i)
            fe->spch[offset + i]
                += (int16) ((!(s3_rand_int31() % 4)) ? 1 : 0);

    return fe_spch_to_frame(fe, offset + len);
}